

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

QRect __thiscall
QtMWidgets::SliderPrivate::grooveHighlightedRect(SliderPrivate *this,QRect *sh,QRect *gr)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QRect QVar5;
  QMargins local_78;
  SliderPrivate *local_68;
  undefined1 local_60 [24];
  SliderPrivate *local_48;
  QRect local_40;
  int grhh;
  int grhw;
  QRect *gr_local;
  QRect *sh_local;
  SliderPrivate *this_local;
  QRect grh;
  
  local_40.y2 = 0;
  local_40.x2 = 0;
  _grhh = gr;
  gr_local = sh;
  sh_local = (QRect *)this;
  QRect::QRect((QRect *)&this_local);
  uVar4 = QAbstractSlider::invertedAppearance();
  if ((uVar4 & 1) == 0) {
    iVar2 = QAbstractSlider::orientation();
    if (iVar2 == 2) {
      iVar2 = QRect::height(_grhh);
      iVar3 = QRect::y(gr_local);
      local_40.x2 = (iVar2 - iVar3) - this->radius;
    }
    else {
      iVar2 = QRect::width(_grhh);
      iVar3 = QRect::x(gr_local);
      local_40.y2 = (iVar2 - iVar3) - this->radius;
    }
    pQVar1 = _grhh;
    QMargins::QMargins((QMargins *)(local_60 + 8),0,0,local_40.y2,local_40.x2);
    QVar5 = QRect::marginsRemoved(pQVar1,(QMargins *)(local_60 + 8));
    local_48 = QVar5._0_8_;
    this_local = local_48;
    local_40._0_8_ = QVar5._8_8_;
    grh.x1 = local_40.x1;
    grh.y1 = local_40.y1;
  }
  else {
    iVar2 = QAbstractSlider::orientation();
    if (iVar2 == 2) {
      local_40.x2 = QRect::y(gr_local);
      local_40.x2 = local_40.x2 + this->radius;
    }
    else {
      local_40.y2 = QRect::x(gr_local);
      local_40.y2 = local_40.y2 + this->radius;
    }
    pQVar1 = _grhh;
    QMargins::QMargins(&local_78,local_40.y2,local_40.x2,0,0);
    QVar5 = QRect::marginsRemoved(pQVar1,&local_78);
    local_68 = QVar5._0_8_;
    this_local = local_68;
    local_60._0_8_ = QVar5._8_8_;
    grh.x1 = local_60._0_4_;
    grh.y1 = local_60._4_4_;
  }
  QVar5.x2 = grh.x1;
  QVar5.y2 = grh.y1;
  QVar5._0_8_ = this_local;
  return QVar5;
}

Assistant:

QRect
SliderPrivate::grooveHighlightedRect( const QRect & sh, const QRect & gr ) const
{
	int grhw = 0, grhh = 0;

	QRect grh;

	if( !q->invertedAppearance() )
	{
		if( q->orientation() == Qt::Vertical )
			grhh = gr.height() - sh.y() - radius;
		else
			grhw = gr.width() - sh.x() - radius;

		grh = gr.marginsRemoved( QMargins( 0, 0, grhw, grhh ) );
	}
	else
	{
		if( q->orientation() == Qt::Vertical )
			grhh = sh.y() + radius;
		else
			grhw = sh.x() + radius;

		grh = gr.marginsRemoved( QMargins( grhw, grhh, 0, 0 ) );
	}

	return grh;
}